

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_> *
__thiscall
CConnman::GetReachableEmptyNetworks
          (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
           *__return_storage_ptr__,CConnman *this)

{
  bool bVar1;
  size_t sVar2;
  __hashtable *__h;
  int n;
  Network net_00;
  long in_FS_OFFSET;
  Network net;
  Network local_44;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_h)._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  net_00 = NET_UNROUTABLE;
  do {
    local_44 = net_00;
    if ((net_00 != NET_UNROUTABLE) && (net_00 != NET_INTERNAL)) {
      bVar1 = ReachableNets::Contains(&g_reachable_nets,net_00);
      if (bVar1) {
        sVar2 = AddrMan::Size(this->addrman,(optional<Network>)((ulong)local_44 | 0x100000000),
                              (optional<bool>)0x0);
        if (sVar2 == 0) {
          local_40 = __return_storage_ptr__;
          std::
          _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<Network_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Network,false>>>>
                    ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)__return_storage_ptr__,&local_44,&local_40);
        }
      }
    }
    net_00 = net_00 + NET_IPV4;
  } while (net_00 != NET_MAX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::unordered_set<Network> CConnman::GetReachableEmptyNetworks() const
{
    std::unordered_set<Network> networks{};
    for (int n = 0; n < NET_MAX; n++) {
        enum Network net = (enum Network)n;
        if (net == NET_UNROUTABLE || net == NET_INTERNAL) continue;
        if (g_reachable_nets.Contains(net) && addrman.Size(net, std::nullopt) == 0) {
            networks.insert(net);
        }
    }
    return networks;
}